

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

aiAnimation * MakeDummyAnimation(void)

{
  aiAnimation *paVar1;
  aiNodeAnim **ppaVar2;
  aiNodeAnim *paVar3;
  
  paVar1 = (aiAnimation *)operator_new(0x448);
  (paVar1->mName).length = 0;
  (paVar1->mName).data[0] = '\0';
  memset((paVar1->mName).data + 1,0x1b,0x3ff);
  paVar1->mDuration = -1.0;
  paVar1->mTicksPerSecond = 0.0;
  paVar1->mChannels = (aiNodeAnim **)0x0;
  paVar1->mNumMeshChannels = 0;
  paVar1->mMeshChannels = (aiMeshAnim **)0x0;
  paVar1->mNumMorphMeshChannels = 0;
  paVar1->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  paVar1->mNumChannels = 1;
  ppaVar2 = (aiNodeAnim **)operator_new__(8);
  paVar1->mChannels = ppaVar2;
  paVar3 = (aiNodeAnim *)operator_new(0x438);
  (paVar3->mNodeName).length = 0;
  (paVar3->mNodeName).data[0] = '\0';
  memset((paVar3->mNodeName).data + 1,0x1b,0x3ff);
  paVar3->mRotationKeys = (aiQuatKey *)0x0;
  paVar3->mNumScalingKeys = 0;
  *(undefined8 *)&paVar3->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar3->mPositionKeys + 4) = 0;
  paVar3->mScalingKeys = (aiVectorKey *)0x0;
  paVar3->mPreState = aiAnimBehaviour_DEFAULT;
  paVar3->mPostState = aiAnimBehaviour_DEFAULT;
  *ppaVar2 = paVar3;
  (paVar3->mNodeName).length = 6;
  builtin_strncpy((paVar3->mNodeName).data,"<test>",7);
  return paVar1;
}

Assistant:

aiAnimation* MakeDummyAnimation() {
    aiAnimation* p = new aiAnimation();
    p->mNumChannels = 1;
    p->mChannels = new aiNodeAnim*[1];
    aiNodeAnim* anim = p->mChannels[0] = new aiNodeAnim();
    anim->mNodeName.Set("<test>");
    return p;
}